

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeVisitor.cpp
# Opt level: O2

void __thiscall
OpenMD::CompositeVisitor::addVisitor(CompositeVisitor *this,BaseVisitor *newVisitor,int priority)

{
  list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
  *__position;
  const_iterator __position_00;
  pair<OpenMD::BaseVisitor_*,_int> local_38;
  
  __position = &this->visitorList;
  __position_00._M_node = (_List_node_base *)__position;
  while (__position_00._M_node = (__position_00._M_node)->_M_next, local_38.first = newVisitor,
        local_38.second = priority, __position_00._M_node != (_List_node_base *)__position) {
    if (*(int *)&__position_00._M_node[1]._M_prev < priority) {
      std::__cxx11::
      list<std::pair<OpenMD::BaseVisitor*,int>,std::allocator<std::pair<OpenMD::BaseVisitor*,int>>>
      ::emplace<std::pair<OpenMD::BaseVisitor*,int>>
                ((list<std::pair<OpenMD::BaseVisitor*,int>,std::allocator<std::pair<OpenMD::BaseVisitor*,int>>>
                  *)__position,__position_00,&local_38);
    }
  }
  std::__cxx11::
  list<std::pair<OpenMD::BaseVisitor*,int>,std::allocator<std::pair<OpenMD::BaseVisitor*,int>>>::
  emplace<std::pair<OpenMD::BaseVisitor*,int>>
            ((list<std::pair<OpenMD::BaseVisitor*,int>,std::allocator<std::pair<OpenMD::BaseVisitor*,int>>>
              *)__position,(const_iterator)__position,&local_38);
  return;
}

Assistant:

void CompositeVisitor::addVisitor(BaseVisitor* newVisitor, int priority) {
    VisitorIterator i;
    int curPriority;

    for (i = visitorList.begin(); i != visitorList.end(); ++i) {
      curPriority = (*i).second;
      // if new visitor has higher priority, just insert it before current
      // visitor
      if (priority > curPriority) {
        visitorList.insert(i, std::make_pair(newVisitor, priority));
      }
    }

    // if new visitor has lowest priority, insert it at the end of the list
    visitorList.insert(visitorList.end(), std::make_pair(newVisitor, priority));
  }